

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O0

void __thiscall
obs::signal<void(int,int,double)>::operator()
          (signal<void(int,int,double)> *this,int *args,int *args_1,double *args_2)

{
  bool bVar1;
  slot<void_(int,_int,_double)> *this_00;
  slot<void_(int,_int,_double)> *slot;
  undefined1 local_80 [8];
  iterator __end0;
  iterator __begin0;
  slot_list *__range3;
  double *args_local_2;
  int *args_local_1;
  int *args_local;
  signal<void_(int,_int,_double)> *this_local;
  
  safe_list<obs::slot<void_(int,_int,_double)>_>::begin
            ((iterator *)&__end0.m_next_iterator,
             (safe_list<obs::slot<void_(int,_int,_double)>_> *)(this + 8));
  safe_list<obs::slot<void_(int,_int,_double)>_>::end
            ((iterator *)local_80,(safe_list<obs::slot<void_(int,_int,_double)>_> *)(this + 8));
  while( true ) {
    bVar1 = safe_list<obs::slot<void_(int,_int,_double)>_>::iterator::operator!=
                      ((iterator *)&__end0.m_next_iterator,(iterator *)local_80);
    if (!bVar1) break;
    this_00 = safe_list<obs::slot<void_(int,_int,_double)>_>::iterator::operator*
                        ((iterator *)&__end0.m_next_iterator);
    if (this_00 != (slot<void_(int,_int,_double)> *)0x0) {
      slot<void(int,int,double)>::operator()
                ((slot<void(int,int,double)> *)this_00,args,args_1,args_2);
    }
    safe_list<obs::slot<void_(int,_int,_double)>_>::iterator::operator++
              ((iterator *)&__end0.m_next_iterator);
  }
  safe_list<obs::slot<void_(int,_int,_double)>_>::iterator::~iterator((iterator *)local_80);
  safe_list<obs::slot<void_(int,_int,_double)>_>::iterator::~iterator
            ((iterator *)&__end0.m_next_iterator);
  return;
}

Assistant:

void operator()(Args2&&...args) {
    for (auto slot : m_slots)
      if (slot)
        (*slot)(std::forward<Args2>(args)...);
  }